

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

Result<fs::path> * wallet::GetWalletPath(string *name)

{
  file_type fVar1;
  byte bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  Result<fs::path> *this;
  Result<fs::path> *in_RDI;
  long in_FS_OFFSET;
  bool bVar3;
  _Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
  _Var4;
  file_type path_type;
  path wallet_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd98;
  path *in_stack_fffffffffffffda0;
  path *in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdc8;
  undefined1 in_stack_fffffffffffffdcc;
  undefined1 in_stack_fffffffffffffdcd;
  undefined1 in_stack_fffffffffffffdce;
  undefined1 in_stack_fffffffffffffdcf;
  undefined1 uVar5;
  undefined1 uVar6;
  path *in_stack_fffffffffffffdd0;
  Result<fs::path> *base;
  path local_30;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  base = in_RDI;
  GetWalletDir();
  fs::PathFromString((string *)
                     CONCAT17(in_stack_fffffffffffffdcf,
                              CONCAT16(in_stack_fffffffffffffdce,
                                       CONCAT15(in_stack_fffffffffffffdcd,
                                                CONCAT14(in_stack_fffffffffffffdcc,
                                                         in_stack_fffffffffffffdc8)))));
  fsbridge::AbsPathJoin((path *)base,in_stack_fffffffffffffdd0);
  fs::path::~path((path *)in_stack_fffffffffffffd98);
  fs::path::~path((path *)in_stack_fffffffffffffd98);
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::filesystem::symlink_status(&local_30);
  fVar1 = std::filesystem::file_status::type((file_status *)in_stack_fffffffffffffd98);
  bVar3 = false;
  uVar6 = true;
  if ((fVar1 != not_found) && (uVar6 = true, fVar1 != directory)) {
    if (fVar1 == symlink) {
      in_stack_fffffffffffffdce = std::filesystem::is_directory(in_stack_fffffffffffffda8);
      uVar6 = true;
      if ((bool)in_stack_fffffffffffffdce) goto LAB_00ae9a95;
    }
    uVar5 = 1;
    bVar3 = fVar1 == regular;
    in_stack_fffffffffffffdcd = false;
    uVar6 = in_stack_fffffffffffffdcd;
    if (bVar3) {
      fs::PathFromString((string *)
                         CONCAT17(1,CONCAT16(in_stack_fffffffffffffdce,
                                             (uint6)CONCAT14(in_stack_fffffffffffffdcc,
                                                             in_stack_fffffffffffffdc8))));
      fs::path::filename((path *)CONCAT17(uVar5,CONCAT16(in_stack_fffffffffffffdce,
                                                         CONCAT15(in_stack_fffffffffffffdcd,
                                                                  CONCAT14(in_stack_fffffffffffffdcc
                                                                           ,
                                                  in_stack_fffffffffffffdc8)))));
      fs::PathFromString((string *)
                         CONCAT17(uVar5,CONCAT16(in_stack_fffffffffffffdce,
                                                 CONCAT15(in_stack_fffffffffffffdcd,
                                                          CONCAT14(in_stack_fffffffffffffdcc,
                                                                   in_stack_fffffffffffffdc8)))));
      in_stack_fffffffffffffdcd =
           std::filesystem::__cxx11::operator==(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0)
      ;
      uVar6 = in_stack_fffffffffffffdcd;
    }
  }
LAB_00ae9a95:
  bVar2 = uVar6 ^ 0xff;
  if (bVar3) {
    fs::path::~path((path *)in_stack_fffffffffffffd98);
    fs::path::~path((path *)in_stack_fffffffffffffd98);
    fs::path::~path((path *)in_stack_fffffffffffffd98);
  }
  if ((bVar2 & 1) == 0) {
    fs::path::path((path *)in_stack_fffffffffffffd98,(path *)0xae9d55);
    util::Result<fs::path>::Result
              ((Result<fs::path> *)in_stack_fffffffffffffda8,(T *)in_stack_fffffffffffffda0);
    fs::path::~path((path *)in_stack_fffffffffffffd98);
  }
  else {
    GetWalletDir();
    fs::PathToString_abi_cxx11_((path *)in_stack_fffffffffffffda0);
    _Var4 = fs::quoted(&in_stack_fffffffffffffda8->_M_pathname);
    this = _Var4._8_8_;
    tinyformat::
    format<std::__cxx11::string,std::__detail::_Quoted_string<std::__cxx11::string_const&,char>>
              ((char *)base,args,
               (_Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
                *)CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffffdce,
                                          CONCAT15(in_stack_fffffffffffffdcd,
                                                   CONCAT14(bVar2,in_stack_fffffffffffffdc8)))));
    Untranslated(args);
    util::Result<fs::path>::Result(this,(Error *)in_stack_fffffffffffffda0);
    util::Error::~Error((Error *)in_stack_fffffffffffffd98);
    std::__cxx11::string::~string(in_stack_fffffffffffffd98);
    std::__cxx11::string::~string(in_stack_fffffffffffffd98);
    fs::path::~path((path *)in_stack_fffffffffffffd98);
  }
  fs::path::~path((path *)in_stack_fffffffffffffd98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static util::Result<fs::path> GetWalletPath(const std::string& name)
{
    // Do some checking on wallet path. It should be either a:
    //
    // 1. Path where a directory can be created.
    // 2. Path to an existing directory.
    // 3. Path to a symlink to a directory.
    // 4. For backwards compatibility, the name of a data file in -walletdir.
    const fs::path wallet_path = fsbridge::AbsPathJoin(GetWalletDir(), fs::PathFromString(name));
    fs::file_type path_type = fs::symlink_status(wallet_path).type();
    if (!(path_type == fs::file_type::not_found || path_type == fs::file_type::directory ||
          (path_type == fs::file_type::symlink && fs::is_directory(wallet_path)) ||
          (path_type == fs::file_type::regular && fs::PathFromString(name).filename() == fs::PathFromString(name)))) {
        return util::Error{Untranslated(strprintf(
              "Invalid -wallet path '%s'. -wallet path should point to a directory where wallet.dat and "
              "database/log.?????????? files can be stored, a location where such a directory could be created, "
              "or (for backwards compatibility) the name of an existing data file in -walletdir (%s)",
              name, fs::quoted(fs::PathToString(GetWalletDir()))))};
    }
    return wallet_path;
}